

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O0

QString * __thiscall
DebugDirEntryWrapper::translateType
          (QString *__return_storage_ptr__,DebugDirEntryWrapper *this,int type)

{
  int type_local;
  DebugDirEntryWrapper *this_local;
  
  switch(type) {
  case 0:
    QString::QString(__return_storage_ptr__,"unknown");
    break;
  case 1:
    QString::QString(__return_storage_ptr__,"COFF");
    break;
  case 2:
    QString::QString(__return_storage_ptr__,"Visual C++ (CodeView)");
    break;
  case 3:
    QString::QString(__return_storage_ptr__,"Frame pointer omission");
    break;
  case 4:
    QString::QString(__return_storage_ptr__,"DBG file");
    break;
  case 5:
    QString::QString(__return_storage_ptr__,"A copy of .pdata section");
    break;
  case 6:
    QString::QString(__return_storage_ptr__,"Reserved");
    break;
  case 7:
    QString::QString(__return_storage_ptr__,"mapping from an RVA in image to an RVA in source image"
                    );
    break;
  case 8:
    QString::QString(__return_storage_ptr__,"mapping from an RVA in source image to an RVA in image"
                    );
    break;
  case 9:
    QString::QString(__return_storage_ptr__,"Borland");
    break;
  case 10:
    QString::QString(__return_storage_ptr__,"Reserved");
    break;
  case 0xb:
    QString::QString(__return_storage_ptr__,"CLSID");
    break;
  case 0xc:
    QString::QString(__return_storage_ptr__,"VC Feature");
    break;
  case 0xd:
    QString::QString(__return_storage_ptr__,"POGO");
    break;
  case 0xe:
    QString::QString(__return_storage_ptr__,"ILTCG");
    break;
  case 0xf:
    QString::QString(__return_storage_ptr__,"MPX");
    break;
  case 0x10:
    QString::QString(__return_storage_ptr__,"REPRO");
    break;
  default:
    QString::QString(__return_storage_ptr__,"<Unknown>");
  }
  return __return_storage_ptr__;
}

Assistant:

QString DebugDirEntryWrapper::translateType(int type)
{
    switch (type) {
        case pe::DT_UNKNOWN : return "unknown";
        case pe::DT_COFF : return "COFF";
        case pe::DT_CODEVIEW : return "Visual C++ (CodeView)";
        case pe::DT_FPO : return "Frame pointer omission";
        case pe::DT_MISC : return "DBG file";
        case pe::DT_EXCEPTION : return "A copy of .pdata section";
        case pe::DT_FIXUP : return "Reserved";
        case pe::DT_OMAP_TO_SRC : return "mapping from an RVA in image to an RVA in source image";
        case pe::DT_OMAP_FROM_SRC : return "mapping from an RVA in source image to an RVA in image";
        case pe::DT_BORLAND : return "Borland";
        case pe::DT_RESERVED10 : return "Reserved";
        case pe::DT_CLSID : return "CLSID";
        case pe::DT_VC_FEATURE : return "VC Feature";
        case pe::DT_POGO : return "POGO";
        case pe::DT_ILTCG : return "ILTCG";
        case pe::DT_MPX : return "MPX";
        case pe::DT_REPRO : return "REPRO";
    }
    return "<Unknown>";
}